

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

int Fra_ImpVerifyUsingSimulation(Fra_Man_t *p)

{
  int iVar1;
  int Left_00;
  Fra_Sml_t *p_00;
  void *__s;
  int local_44;
  int local_40;
  int Counter;
  int i;
  int Imp;
  int Right;
  int Left;
  char *pfFails;
  Fra_Sml_t *pSeq;
  int nSimWords;
  int nFrames;
  Fra_Man_t *p_local;
  
  if ((p->pCla->vImps == (Vec_Int_t *)0x0) || (iVar1 = Vec_IntSize(p->pCla->vImps), iVar1 == 0)) {
    p_local._4_4_ = 0;
  }
  else {
    p_00 = Fra_SmlSimulateSeq(p->pManAig,p->pPars->nFramesP,2000,8,1);
    iVar1 = Vec_IntSize(p->pCla->vImps);
    __s = malloc((long)iVar1);
    iVar1 = Vec_IntSize(p->pCla->vImps);
    memset(__s,0,(long)iVar1);
    for (local_40 = 0; iVar1 = Vec_IntSize(p->pCla->vImps), local_40 < iVar1;
        local_40 = local_40 + 1) {
      iVar1 = Vec_IntEntry(p->pCla->vImps,local_40);
      Left_00 = Fra_ImpLeft(iVar1);
      iVar1 = Fra_ImpRight(iVar1);
      iVar1 = Sml_NodeCheckImp(p_00,Left_00,iVar1);
      *(byte *)((long)__s + (long)local_40) = (iVar1 != 0 ^ 0xffU) & 1;
    }
    local_44 = 0;
    for (local_40 = 0; iVar1 = Vec_IntSize(p->pCla->vImps), local_40 < iVar1;
        local_40 = local_40 + 1) {
      local_44 = *(char *)((long)__s + (long)local_40) + local_44;
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    Fra_SmlStop(p_00);
    p_local._4_4_ = local_44;
  }
  return p_local._4_4_;
}

Assistant:

int Fra_ImpVerifyUsingSimulation( Fra_Man_t * p )
{
    int nFrames = 2000;
    int nSimWords = 8;
    Fra_Sml_t * pSeq;
    char * pfFails;
    int Left, Right, Imp, i, Counter;
    if ( p->pCla->vImps == NULL || Vec_IntSize(p->pCla->vImps) == 0 )
        return 0;
    // simulate the AIG manager with combinational patterns
    pSeq = Fra_SmlSimulateSeq( p->pManAig, p->pPars->nFramesP, nFrames, nSimWords, 1  );
    // go through the implications and check how many of them do not hold
    pfFails = ABC_ALLOC( char, Vec_IntSize(p->pCla->vImps) );
    memset( pfFails, 0, sizeof(char) * Vec_IntSize(p->pCla->vImps) );
    Vec_IntForEachEntry( p->pCla->vImps, Imp, i )
    {
        Left = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        pfFails[i] = !Sml_NodeCheckImp( pSeq, Left, Right );
    }
    // count how many has failed
    Counter = 0;
    for ( i = 0; i < Vec_IntSize(p->pCla->vImps); i++ )
        Counter += pfFails[i];
    ABC_FREE( pfFails );
    Fra_SmlStop( pSeq );
    return Counter;
}